

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::smudge(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
         *this,Lit *idx)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = idx->x;
  if ((this->dirty).map.sz <= iVar1) {
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                  ,0x28,
                  "V &Minisat::IntMap<Minisat::Lit, char, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = char, MkIndex = Minisat::MkIndexLit]"
                 );
  }
  pcVar2 = (this->dirty).map.data;
  if (pcVar2[iVar1] != '\0') {
    return;
  }
  pcVar2[iVar1] = '\x01';
  vec<Minisat::Lit,_int>::push(&this->dirties,idx);
  return;
}

Assistant:

void  smudge    (const K& idx){
        if (dirty[idx] == 0){
            dirty[idx] = 1;
            dirties.push(idx);
        }
    }